

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

void __thiscall
HighsDomain::computeMinActivity
          (HighsDomain *this,HighsInt start,HighsInt end,HighsInt *ARindex,double *ARvalue,
          HighsInt *ninfmin,HighsCDouble *activitymin)

{
  bool bVar1;
  HighsInt col;
  int stackpos;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  HighsInt tmp;
  HighsInt local_34;
  
  bVar1 = this->infeasible_;
  activitymin->hi = 0.0;
  activitymin->lo = 0.0;
  *ninfmin = 0;
  if (bVar1 == true) {
    for (lVar2 = (long)start; end != lVar2; lVar2 = lVar2 + 1) {
      col = ARindex[lVar2];
      dVar5 = ARvalue[lVar2];
      stackpos = this->infeasible_pos + -1;
      dVar3 = getColLowerPos(this,col,stackpos,&local_34);
      dVar4 = getColUpperPos(this,col,stackpos,&local_34);
      if (0.0 <= dVar5) {
        dVar4 = dVar3;
        if (-INFINITY < dVar3) goto LAB_0029fb45;
LAB_0029fb57:
        *ninfmin = *ninfmin + 1;
      }
      else {
        if (INFINITY <= dVar4) goto LAB_0029fb57;
LAB_0029fb45:
        dVar5 = dVar5 * dVar4;
        if (dVar5 <= -INFINITY) goto LAB_0029fb57;
        HighsCDouble::operator+=(activitymin,dVar5);
      }
    }
  }
  else {
    for (lVar2 = (long)start; end != lVar2; lVar2 = lVar2 + 1) {
      dVar5 = activityContributionMin
                        (ARvalue[lVar2],
                         (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start + ARindex[lVar2],
                         (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start + ARindex[lVar2]);
      if (-INFINITY < dVar5) {
        HighsCDouble::operator+=(activitymin,dVar5);
      }
      else {
        *ninfmin = *ninfmin + 1;
      }
    }
  }
  HighsCDouble::renormalize(activitymin);
  return;
}

Assistant:

void HighsDomain::computeMinActivity(HighsInt start, HighsInt end,
                                     const HighsInt* ARindex,
                                     const double* ARvalue, HighsInt& ninfmin,
                                     HighsCDouble& activitymin) {
  if (infeasible_) {
    activitymin = 0.0;
    ninfmin = 0;
    for (HighsInt j = start; j != end; ++j) {
      HighsInt col = ARindex[j];
      double val = ARvalue[j];

      assert(col < int(col_lower_.size()));

      HighsInt tmp;
      double lb = getColLowerPos(col, infeasible_pos - 1, tmp);
      double ub = getColUpperPos(col, infeasible_pos - 1, tmp);
      double contributionmin = activityContributionMin(val, lb, ub);

      if (contributionmin == -kHighsInf)
        ++ninfmin;
      else
        activitymin += contributionmin;
    }

  } else {
    activitymin = 0.0;
    ninfmin = 0;
    for (HighsInt j = start; j != end; ++j) {
      HighsInt col = ARindex[j];
      double val = ARvalue[j];

      assert(col < int(col_lower_.size()));

      double contributionmin =
          activityContributionMin(val, col_lower_[col], col_upper_[col]);

      if (contributionmin == -kHighsInf)
        ++ninfmin;
      else
        activitymin += contributionmin;
    }
  }
  activitymin.renormalize();
}